

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui-SFML.cpp
# Opt level: O0

void ImGui::SFML::Update(Window *window,RenderTarget *target,Time dt)

{
  bool bVar1;
  ImGuiIO *pIVar2;
  Vector2i *mousePos;
  uint extraout_var;
  uint extraout_var_00;
  int local_6c;
  Vector2<unsigned_int> local_60;
  Vector2<float> local_58;
  Vector2i local_50;
  Window *local_48;
  Vector2<unsigned_int> local_3c;
  Vector2<float> local_34;
  Vector2i local_2c;
  int local_24;
  RenderTarget *pRStack_20;
  ImGuiMouseCursor mouse_cursor;
  RenderTarget *target_local;
  Window *window_local;
  Time dt_local;
  
  pRStack_20 = target;
  target_local = (RenderTarget *)window;
  window_local = (Window *)dt.m_microseconds;
  SetCurrentWindow(window);
  if ((anonymous_namespace)::s_currWindowCtx == 0) {
    __assert_fail("s_currWindowCtx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/imgui-sfml-src/imgui-SFML.cpp"
                  ,0x1af,"void ImGui::SFML::Update(sf::Window &, sf::RenderTarget &, sf::Time)");
  }
  pIVar2 = GetIO();
  if ((pIVar2->MouseDrawCursor & 1U) == 0) {
    local_6c = GetMouseCursor();
  }
  else {
    local_6c = -1;
  }
  local_24 = local_6c;
  if (*(int *)((anonymous_namespace)::s_currWindowCtx + 0x40) != local_6c) {
    *(int *)((anonymous_namespace)::s_currWindowCtx + 0x40) = local_6c;
    anon_unknown.dwarf_f6bf2::updateMouseCursor((Window *)target_local);
  }
  if ((*(byte *)((anonymous_namespace)::s_currWindowCtx + 0x39) & 1) == 0) {
    bVar1 = sf::Touch::isDown(0);
    if (bVar1) {
      local_2c = sf::Touch::getPosition(0,(Window *)target_local);
      *(Vector2i *)((anonymous_namespace)::s_currWindowCtx + 0x48) = local_2c;
    }
    mousePos = (Vector2i *)((anonymous_namespace)::s_currWindowCtx + 0x48);
    local_3c.x = (*pRStack_20->_vptr_RenderTarget[2])();
    local_3c.y = extraout_var;
    sf::Vector2<float>::Vector2<unsigned_int>(&local_34,&local_3c);
    local_48 = window_local;
    Update(mousePos,&local_34,(Time)window_local);
  }
  else {
    local_50 = sf::Mouse::getPosition((Window *)target_local);
    local_60.x = (*pRStack_20->_vptr_RenderTarget[2])();
    local_60.y = extraout_var_00;
    sf::Vector2<float>::Vector2<unsigned_int>(&local_58,&local_60);
    Update(&local_50,&local_58,(Time)window_local);
  }
  return;
}

Assistant:

void Update(sf::Window& window, sf::RenderTarget& target, sf::Time dt) {
    SetCurrentWindow(window);
    assert(s_currWindowCtx);

    // Update OS/hardware mouse cursor if imgui isn't drawing a software cursor
    ImGuiMouseCursor mouse_cursor =
        ImGui::GetIO().MouseDrawCursor ? ImGuiMouseCursor_None : ImGui::GetMouseCursor();
    if (s_currWindowCtx->lastCursor != mouse_cursor) {
        s_currWindowCtx->lastCursor = mouse_cursor;
        updateMouseCursor(window);
    }

    if (!s_currWindowCtx->mouseMoved) {
        if (sf::Touch::isDown(0)) s_currWindowCtx->touchPos = sf::Touch::getPosition(0, window);

        Update(s_currWindowCtx->touchPos, static_cast<sf::Vector2f>(target.getSize()), dt);
    } else {
        Update(sf::Mouse::getPosition(window), static_cast<sf::Vector2f>(target.getSize()), dt);
    }
}